

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O2

FT_Error TT_Get_MM_Var(TT_Face face,FT_MM_Var **master)

{
  FT_UShort *pFVar1;
  byte *pbVar2;
  FT_Stream pFVar3;
  long lVar4;
  void *pvVar5;
  FT_Memory memory;
  byte bVar6;
  char cVar7;
  FT_UShort FVar8;
  FT_Error FVar9;
  FT_MM_Var *pFVar10;
  GX_Blend pGVar11;
  FT_Var_Axis *pFVar12;
  GX_Blend pGVar13;
  FT_ULong FVar14;
  FT_Fixed *pFVar15;
  GX_MVarTable pGVar16;
  GX_Value pGVar17;
  FT_Short *pFVar18;
  FT_String *pFVar19;
  long lVar20;
  FT_Var_Named_Style *pFVar21;
  FT_UInt FVar22;
  FT_Var_Named_Style *pFVar23;
  GX_Value pGVar24;
  ulong uVar25;
  FT_Offset size;
  ulong uVar26;
  FT_Fixed *pFVar27;
  ulong uVar28;
  uint uVar29;
  char *pcVar30;
  ulong uVar31;
  FT_UInt num_coords;
  FT_Memory memory_00;
  bool bVar32;
  FT_Int dummy2;
  FT_Error error;
  TT_Face local_e0;
  GX_Blend local_d8;
  FT_ULong local_d0;
  ulong local_c8;
  long local_c0;
  FT_ULong local_b8;
  FT_MM_Var *local_b0;
  FT_Memory local_a8;
  ulong local_a0;
  long local_98;
  ulong local_90;
  FT_MM_Var **local_88;
  FT_ULong table_len;
  GX_FVar_Head fvar_head;
  GX_FVar_Axis axis_rec;
  
  memory_00 = (face->root).memory;
  pFVar3 = (face->root).stream;
  error = 0;
  pGVar13 = face->blend;
  local_e0 = face;
  if (pGVar13 == (GX_Blend)0x0) {
    error = (*face->goto_table)(face,0x67766172,pFVar3,&table_len);
    if ((error != 0) &&
       (error = (*local_e0->goto_table)(local_e0,0x43464632,pFVar3,&table_len), error != 0)) {
      return error;
    }
    error = (*local_e0->goto_table)(local_e0,0x66766172,pFVar3,&table_len);
    if (error != 0) {
      return error;
    }
    FVar14 = FT_Stream_Pos(pFVar3);
    error = FT_Stream_ReadFields(pFVar3,TT_Get_MM_Var::fvar_fields,&fvar_head);
    if (error != 0) {
      return error;
    }
    local_c0 = CONCAT44(local_c0._4_4_,(uint)fvar_head.instanceSize);
    local_d8 = (GX_Blend)(ulong)fvar_head.axisCount;
    pGVar11 = (GX_Blend)ft_mem_alloc(memory_00,0x90,&error);
    local_e0->blend = pGVar11;
    if (error != 0) {
      return error;
    }
    bVar32 = (int)local_d8 * 4 + 6 != (int)local_c0;
    num_coords = (FT_UInt)fvar_head.axisCount;
  }
  else {
    num_coords = pGVar13->num_axis;
    bVar32 = true;
    FVar14 = 0;
    pGVar11 = pGVar13;
  }
  uVar31 = (ulong)num_coords;
  uVar29 = (uint)(local_e0->root).style_flags >> 0x10;
  uVar26 = uVar31 * 2 + 7 & 0xfffffffffffffff8;
  lVar20 = uVar31 * 0x30;
  uVar28 = (ulong)(uVar29 << 4);
  local_c0 = (ulong)(uVar29 * num_coords) * 8;
  local_88 = master;
  if (pGVar13 != (GX_Blend)0x0) goto LAB_00166f48;
  local_c8 = CONCAT44(local_c8._4_4_,uVar29);
  local_d0 = CONCAT71(local_d0._1_7_,bVar32);
  size = local_c0 + num_coords * 5 + uVar26 + lVar20 + uVar28 + 0x20;
  pGVar11->mmvar_len = size;
  local_b8 = FVar14;
  local_a8 = memory_00;
  local_a0 = uVar28;
  local_98 = lVar20;
  local_90 = uVar26;
  local_b0 = (FT_MM_Var *)ft_mem_alloc(memory_00,size,&error);
  if (error != 0) {
    return error;
  }
  local_e0->blend->mmvar = local_b0;
  local_b0->num_axis = num_coords;
  local_b0->num_designs = 0xffffffff;
  local_b0->num_namedstyles = (FT_UInt)local_c8;
  local_d8 = (GX_Blend)(local_b0 + 1);
  pFVar12 = (FT_Var_Axis *)((long)&local_b0[1].num_axis + local_90);
  local_b0->axis = pFVar12;
  pFVar23 = (FT_Var_Named_Style *)((long)&pFVar12->name + local_98);
  local_b0->namedstyle = pFVar23;
  uVar26 = local_c8 & 0xffffffff;
  pFVar27 = (FT_Fixed *)((long)&local_b0[1].num_axis + local_98 + local_a0 + local_90);
  pFVar21 = pFVar23;
  while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
    pFVar21->coords = pFVar27;
    pFVar21 = pFVar21 + 1;
    pFVar27 = pFVar27 + uVar31;
  }
  pFVar19 = (FT_String *)((long)&pFVar23->coords + local_c0 + local_a0);
  uVar26 = uVar31;
  while (bVar32 = uVar26 != 0, uVar26 = uVar26 - 1, bVar32) {
    pFVar12->name = pFVar19;
    pFVar19 = pFVar19 + 5;
    pFVar12 = pFVar12 + 1;
  }
  FVar9 = FT_Stream_Seek(pFVar3,local_b8 + fvar_head.offsetToData);
  if (FVar9 != 0) {
    return FVar9;
  }
  pFVar12 = local_b0->axis;
  for (lVar20 = 0; error = 0, num_coords != (uint)lVar20; lVar20 = lVar20 + 1) {
    FVar9 = FT_Stream_ReadFields(pFVar3,TT_Get_MM_Var::fvaraxis_fields,&axis_rec);
    if (FVar9 != 0) {
      return FVar9;
    }
    pFVar12->tag = axis_rec.axisTag;
    pFVar12->minimum = axis_rec.minValue;
    pFVar12->def = axis_rec.defaultValue;
    pFVar12->maximum = axis_rec.maxValue;
    pFVar12->strid = (uint)axis_rec.nameID;
    *pFVar12->name = (FT_String)(axis_rec.axisTag >> 0x18);
    pFVar12->name[1] = *(FT_String *)((long)&pFVar12->tag + 2);
    pFVar12->name[2] = *(FT_String *)((long)&pFVar12->tag + 1);
    pFVar12->name[3] = (FT_String)pFVar12->tag;
    pFVar12->name[4] = '\0';
    *(FT_UShort *)((long)&local_d8->num_axis + lVar20 * 2) = axis_rec.flags;
    lVar4 = pFVar12->def;
    if ((lVar4 < pFVar12->minimum) || (pFVar12->maximum < lVar4)) {
      pFVar12->minimum = lVar4;
      pFVar12->maximum = lVar4;
    }
    pFVar12 = pFVar12 + 1;
  }
  pGVar13 = (GX_Blend)ft_mem_realloc(local_a8,8,0,(ulong)(uVar29 * num_coords),(void *)0x0,&error);
  pFVar10 = local_b0;
  pGVar11 = local_e0->blend;
  pGVar11->normalized_stylecoords = (FT_Fixed *)pGVar13;
  if (error != 0) {
    return error;
  }
  if (fvar_head.instanceCount == 0) {
LAB_001673d4:
  }
  else if (pGVar11->avar_loaded == '\0') {
    FVar14 = FT_Stream_Pos(pFVar3);
    ft_var_load_avar(local_e0);
    FVar9 = FT_Stream_Seek(pFVar3,FVar14);
    if (FVar9 != 0) {
      return FVar9;
    }
    pGVar13 = (GX_Blend)local_e0->blend->normalized_stylecoords;
    error = 0;
    goto LAB_001673d4;
  }
  pFVar23 = pFVar10->namedstyle;
  bVar6 = (byte)local_d0 ^ 1;
  FVar14 = 0;
  while ((uint)FVar14 < (uint)fvar_head.instanceCount) {
    error = FT_Stream_EnterFrame(pFVar3,(ulong)((uint)bVar6 * 2) + uVar31 * 4 + 4);
    if (error != 0) {
      return error;
    }
    local_d8 = pGVar13;
    local_b8 = FVar14;
    FVar8 = FT_Stream_GetUShort(pFVar3);
    pFVar23->strid = (uint)FVar8;
    FT_Stream_GetUShort(pFVar3);
    pFVar27 = pFVar23->coords;
    for (lVar20 = 0; num_coords != (uint)lVar20; lVar20 = lVar20 + 1) {
      FVar14 = FT_Stream_GetULong(pFVar3);
      pFVar27[lVar20] = FVar14;
    }
    uVar29 = 0xffff;
    if ((byte)local_d0 == '\0') {
      FVar8 = FT_Stream_GetUShort(pFVar3);
      uVar29 = (uint)FVar8;
    }
    pGVar13 = local_d8;
    pFVar23->psid = uVar29;
    ft_var_to_normalized(local_e0,num_coords,pFVar23->coords,(FT_Fixed *)local_d8);
    pGVar13 = (GX_Blend)(&pGVar13->num_axis + uVar31 * 2);
    FT_Stream_ExitFrame(pFVar3);
    pFVar23 = pFVar23 + 1;
    FVar14 = (FT_ULong)((int)local_b8 + 1);
  }
  if ((FT_UInt)local_c8 != fvar_head.instanceCount) {
    pvVar5 = local_e0->sfnt;
    FVar22 = 0x11;
    cVar7 = (**(code **)((long)pvVar5 + 0xf0))(local_e0,0x11,&axis_rec,&dummy2);
    if (cVar7 == '\0') {
      FVar22 = 2;
      cVar7 = (**(code **)((long)pvVar5 + 0xf0))(local_e0,2,&axis_rec,&dummy2);
      if (cVar7 == '\0') goto LAB_00167560;
    }
    cVar7 = (**(code **)((long)pvVar5 + 0xf0))(local_e0,6,&axis_rec,&dummy2);
    if (cVar7 != '\0') {
      pFVar23 = local_b0->namedstyle;
      uVar26 = (ulong)fvar_head.instanceCount;
      pFVar23[uVar26].strid = FVar22;
      pFVar23[uVar26].psid = 6;
      pFVar27 = pFVar23[uVar26].coords;
      pFVar15 = &local_b0->axis->def;
      for (lVar20 = 0; num_coords != (uint)lVar20; lVar20 = lVar20 + 1) {
        pFVar27[lVar20] = *pFVar15;
        pFVar15 = pFVar15 + 6;
      }
    }
  }
LAB_00167560:
  pFVar3 = (local_e0->root).stream;
  memory = pFVar3->memory;
  pGVar13 = local_e0->blend;
  dummy2 = (*local_e0->goto_table)(local_e0,0x4d564152,pFVar3,&axis_rec.axisTag);
  lVar20 = local_98;
  uVar26 = local_90;
  uVar28 = local_a0;
  memory_00 = local_a8;
  if (dummy2 == 0) {
    local_c8 = FT_Stream_Pos(pFVar3);
    local_d8 = pGVar13;
    FVar8 = FT_Stream_ReadUShort(pFVar3,&dummy2);
    lVar20 = local_98;
    uVar26 = local_90;
    uVar28 = local_a0;
    memory_00 = local_a8;
    if (((dummy2 == 0) &&
        (dummy2 = FT_Stream_Skip(pFVar3,2), lVar20 = local_98, uVar26 = local_90, uVar28 = local_a0,
        memory_00 = local_a8, dummy2 == 0)) && (FVar8 == 1)) {
      pGVar16 = (GX_MVarTable)ft_mem_alloc(memory,0x30,&dummy2);
      local_d8->mvar_table = pGVar16;
      lVar20 = local_98;
      uVar26 = local_90;
      uVar28 = local_a0;
      memory_00 = local_a8;
      if ((dummy2 == 0) &&
         (dummy2 = FT_Stream_Skip(pFVar3,4), lVar20 = local_98, uVar26 = local_90, uVar28 = local_a0
         , memory_00 = local_a8, dummy2 == 0)) {
        FVar8 = FT_Stream_ReadUShort(pFVar3,&dummy2);
        local_d8->mvar_table->valueCount = FVar8;
        lVar20 = local_98;
        uVar26 = local_90;
        uVar28 = local_a0;
        memory_00 = local_a8;
        if ((dummy2 == 0) &&
           (FVar8 = FT_Stream_ReadUShort(pFVar3,&dummy2), pGVar13 = local_d8, lVar20 = local_98,
           uVar26 = local_90, uVar28 = local_a0, memory_00 = local_a8, dummy2 == 0)) {
          local_d0 = FT_Stream_Pos(pFVar3);
          dummy2 = ft_var_load_item_variation_store
                             (local_e0,local_c8 + FVar8,&pGVar13->mvar_table->itemStore);
          lVar20 = local_98;
          uVar26 = local_90;
          uVar28 = local_a0;
          memory_00 = local_a8;
          if (dummy2 == 0) {
            pGVar17 = (GX_Value)
                      ft_mem_realloc(memory,0x10,0,(ulong)pGVar13->mvar_table->valueCount,
                                     (void *)0x0,&dummy2);
            pGVar13 = local_d8;
            local_d8->mvar_table->values = pGVar17;
            lVar20 = local_98;
            uVar26 = local_90;
            uVar28 = local_a0;
            memory_00 = local_a8;
            if (((dummy2 == 0) &&
                (dummy2 = FT_Stream_Seek(pFVar3,local_d0), lVar20 = local_98, uVar26 = local_90,
                uVar28 = local_a0, memory_00 = local_a8, dummy2 == 0)) &&
               (dummy2 = FT_Stream_EnterFrame(pFVar3,(ulong)pGVar13->mvar_table->valueCount << 3),
               lVar20 = local_98, uVar26 = local_90, uVar28 = local_a0, memory_00 = local_a8,
               dummy2 == 0)) {
              pGVar16 = pGVar13->mvar_table;
              pGVar17 = pGVar16->values;
              pGVar24 = pGVar17 + pGVar16->valueCount;
              do {
                if (pGVar24 <= pGVar17) goto LAB_00167765;
                FVar14 = FT_Stream_GetULong(pFVar3);
                pGVar17->tag = FVar14;
                FVar8 = FT_Stream_GetUShort(pFVar3);
                pGVar17->outerIndex = FVar8;
                FVar8 = FT_Stream_GetUShort(pFVar3);
                pGVar17->innerIndex = FVar8;
                pFVar1 = &pGVar17->outerIndex;
              } while (((uint)*pFVar1 < (pGVar16->itemStore).dataCount) &&
                      (pGVar17 = pGVar17 + 1,
                      (uint)FVar8 < (pGVar16->itemStore).varData[*pFVar1].itemCount));
              dummy2 = 8;
LAB_00167765:
              FT_Stream_ExitFrame(pFVar3);
              lVar20 = local_98;
              uVar26 = local_90;
              uVar28 = local_a0;
              memory_00 = local_a8;
              if (dummy2 == 0) {
                pGVar17 = local_d8->mvar_table->values;
                pGVar24 = pGVar17 + local_d8->mvar_table->valueCount;
                for (; pGVar17 < pGVar24; pGVar17 = pGVar17 + 1) {
                  pFVar18 = ft_var_get_value_pointer(local_e0,pGVar17->tag);
                  if (pFVar18 != (FT_Short *)0x0) {
                    pGVar17->unmodified = *pFVar18;
                  }
                }
                pbVar2 = (byte *)((long)&local_e0->variation_support + 1);
                *pbVar2 = *pbVar2 | 1;
                lVar20 = local_98;
                uVar26 = local_90;
                uVar28 = local_a0;
                memory_00 = local_a8;
              }
            }
          }
        }
      }
    }
  }
LAB_00166f48:
  if ((local_88 != (FT_MM_Var **)0x0) &&
     (pFVar10 = (FT_MM_Var *)ft_mem_alloc(memory_00,local_e0->blend->mmvar_len,&error), error == 0))
  {
    memcpy(pFVar10,local_e0->blend->mmvar,local_e0->blend->mmvar_len);
    pFVar12 = (FT_Var_Axis *)((long)&pFVar10[1].num_axis + uVar26);
    pFVar10->axis = pFVar12;
    pFVar23 = (FT_Var_Named_Style *)((long)&pFVar12->name + lVar20);
    pFVar10->namedstyle = pFVar23;
    uVar25 = (ulong)pFVar10->num_namedstyles;
    pFVar27 = (FT_Fixed *)((long)&pFVar10[1].num_axis + lVar20 + uVar28 + uVar26);
    pFVar21 = pFVar23;
    while (bVar32 = uVar25 != 0, uVar25 = uVar25 - 1, bVar32) {
      pFVar21->coords = pFVar27;
      pFVar21 = pFVar21 + 1;
      pFVar27 = pFVar27 + uVar31;
    }
    pFVar19 = (FT_String *)((long)&pFVar23->coords + local_c0 + uVar28);
    while (bVar32 = num_coords != 0, num_coords = num_coords - 1, bVar32) {
      pFVar12->name = pFVar19;
      FVar14 = pFVar12->tag;
      if (FVar14 == 0x6f70737a) {
        pcVar30 = "OpticalSize";
LAB_0016721f:
        pFVar12->name = pcVar30;
      }
      else {
        if (FVar14 == 0x736c6e74) {
          pcVar30 = "Slant";
          goto LAB_0016721f;
        }
        pcVar30 = "Weight";
        if (FVar14 == 0x77676874) goto LAB_0016721f;
        if (FVar14 == 0x77647468) {
          pcVar30 = "Width";
          goto LAB_0016721f;
        }
      }
      pFVar19 = pFVar19 + 5;
      pFVar12 = pFVar12 + 1;
    }
    *local_88 = pFVar10;
  }
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Get_MM_Var( TT_Face      face,
                 FT_MM_Var*  *master )
  {
    FT_Stream            stream     = face->root.stream;
    FT_Memory            memory     = face->root.memory;
    FT_ULong             table_len;
    FT_Error             error      = FT_Err_Ok;
    FT_ULong             fvar_start = 0;
    FT_UInt              i, j;
    FT_MM_Var*           mmvar = NULL;
    FT_Fixed*            next_coords;
    FT_Fixed*            nsc;
    FT_String*           next_name;
    FT_Var_Axis*         a;
    FT_Fixed*            c;
    FT_Var_Named_Style*  ns;
    GX_FVar_Head         fvar_head;
    FT_Bool              usePsName  = 0;
    FT_UInt              num_instances;
    FT_UInt              num_axes;
    FT_UShort*           axis_flags;

    FT_Offset  mmvar_size;
    FT_Offset  axis_flags_size;
    FT_Offset  axis_size;
    FT_Offset  namedstyle_size;
    FT_Offset  next_coords_size;
    FT_Offset  next_name_size;

    FT_Bool  need_init;

    static const FT_Frame_Field  fvar_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Head

      FT_FRAME_START( 16 ),
        FT_FRAME_LONG      ( version ),
        FT_FRAME_USHORT    ( offsetToData ),
        FT_FRAME_SKIP_SHORT,
        FT_FRAME_USHORT    ( axisCount ),
        FT_FRAME_USHORT    ( axisSize ),
        FT_FRAME_USHORT    ( instanceCount ),
        FT_FRAME_USHORT    ( instanceSize ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  fvaraxis_fields[] =
    {

#undef  FT_STRUCTURE
#define FT_STRUCTURE  GX_FVar_Axis

      FT_FRAME_START( 20 ),
        FT_FRAME_ULONG ( axisTag ),
        FT_FRAME_LONG  ( minValue ),
        FT_FRAME_LONG  ( defaultValue ),
        FT_FRAME_LONG  ( maxValue ),
        FT_FRAME_USHORT( flags ),
        FT_FRAME_USHORT( nameID ),
      FT_FRAME_END
    };


    /* read the font data and set up the internal representation */
    /* if not already done                                       */

    need_init = !face->blend;

    if ( need_init )
    {
      FT_TRACE2(( "FVAR " ));

      /* both `fvar' and `gvar' must be present */
      if ( FT_SET_ERROR( face->goto_table( face, TTAG_gvar,
                                           stream, &table_len ) ) )
      {
        /* CFF2 is an alternate to gvar here */
        if ( FT_SET_ERROR( face->goto_table( face, TTAG_CFF2,
                                             stream, &table_len ) ) )
        {
          FT_TRACE1(( "\n"
                      "TT_Get_MM_Var: `gvar' or `CFF2' table is missing\n" ));
          goto Exit;
        }
      }

      if ( FT_SET_ERROR( face->goto_table( face, TTAG_fvar,
                                           stream, &table_len ) ) )
      {
        FT_TRACE1(( "is missing\n" ));
        goto Exit;
      }

      fvar_start = FT_STREAM_POS( );

      /* the validity of the `fvar' header data was already checked */
      /* in function `sfnt_init_face'                               */
      if ( FT_STREAM_READ_FIELDS( fvar_fields, &fvar_head ) )
        goto Exit;

      usePsName = FT_BOOL( fvar_head.instanceSize ==
                           6 + 4 * fvar_head.axisCount );

      FT_TRACE2(( "loaded\n" ));

      FT_TRACE5(( "number of GX style axes: %d\n", fvar_head.axisCount ));

      if ( FT_NEW( face->blend ) )
        goto Exit;

      num_axes = fvar_head.axisCount;
    }
    else
      num_axes = face->blend->num_axis;

    /* `num_instances' holds the number of all named instances, */
    /* including the default instance which might be missing    */
    /* in fvar's table of named instances                       */
    num_instances = (FT_UInt)face->root.style_flags >> 16;

    /* prepare storage area for MM data; this cannot overflow   */
    /* 32-bit arithmetic because of the size limits used in the */
    /* `fvar' table validity check in `sfnt_init_face'          */

    /* the various `*_size' variables, which we also use as     */
    /* offsets into the `mmlen' array, must be multiples of the */
    /* pointer size (except the last one); without such an      */
    /* alignment there might be runtime errors due to           */
    /* misaligned addresses                                     */
#undef  ALIGN_SIZE
#define ALIGN_SIZE( n ) \
          ( ( (n) + sizeof (void*) - 1 ) & ~( sizeof (void*) - 1 ) )

    mmvar_size       = ALIGN_SIZE( sizeof ( FT_MM_Var ) );
    axis_flags_size  = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_UShort ) );
    axis_size        = ALIGN_SIZE( num_axes *
                                   sizeof ( FT_Var_Axis ) );
    namedstyle_size  = ALIGN_SIZE( num_instances *
                                   sizeof ( FT_Var_Named_Style ) );
    next_coords_size = ALIGN_SIZE( num_instances *
                                   num_axes *
                                   sizeof ( FT_Fixed ) );
    next_name_size   = num_axes * 5;

    if ( need_init )
    {
      face->blend->mmvar_len = mmvar_size       +
                               axis_flags_size  +
                               axis_size        +
                               namedstyle_size  +
                               next_coords_size +
                               next_name_size;

      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      face->blend->mmvar = mmvar;

      /* set up pointers and offsets into the `mmvar' array; */
      /* the data gets filled in later on                    */

      mmvar->num_axis =
        num_axes;
      mmvar->num_designs =
        ~0U;                   /* meaningless in this context; each glyph */
                               /* may have a different number of designs  */
                               /* (or tuples, as called by Apple)         */
      mmvar->num_namedstyles =
        num_instances;

      /* alas, no public field in `FT_Var_Axis' for axis flags */
      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis + axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( i = 0; i < num_instances; i++ )
      {
        mmvar->namedstyle[i].coords  = next_coords;
        next_coords                 += num_axes;
      }

      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( i = 0; i < num_axes; i++ )
      {
        mmvar->axis[i].name  = next_name;
        next_name           += 5;
      }

      /* now fill in the data */

      if ( FT_STREAM_SEEK( fvar_start + fvar_head.offsetToData ) )
        goto Exit;

      a = mmvar->axis;
      for ( i = 0; i < num_axes; i++ )
      {
        GX_FVar_Axis  axis_rec;


        if ( FT_STREAM_READ_FIELDS( fvaraxis_fields, &axis_rec ) )
          goto Exit;
        a->tag     = axis_rec.axisTag;
        a->minimum = axis_rec.minValue;
        a->def     = axis_rec.defaultValue;
        a->maximum = axis_rec.maxValue;
        a->strid   = axis_rec.nameID;

        a->name[0] = (FT_String)(   a->tag >> 24 );
        a->name[1] = (FT_String)( ( a->tag >> 16 ) & 0xFF );
        a->name[2] = (FT_String)( ( a->tag >>  8 ) & 0xFF );
        a->name[3] = (FT_String)( ( a->tag       ) & 0xFF );
        a->name[4] = '\0';

        *axis_flags = axis_rec.flags;

        if ( a->minimum > a->def ||
             a->def > a->maximum )
        {
          FT_TRACE2(( "TT_Get_MM_Var:"
                      " invalid \"%s\" axis record; disabling\n",
                      a->name ));

          a->minimum = a->def;
          a->maximum = a->def;
        }

        FT_TRACE5(( "  \"%s\":"
                    " minimum=%.5f, default=%.5f, maximum=%.5f,"
                    " flags=0x%04X\n",
                    a->name,
                    a->minimum / 65536.0,
                    a->def / 65536.0,
                    a->maximum / 65536.0,
                    *axis_flags ));

        a++;
        axis_flags++;
      }

      FT_TRACE5(( "\n" ));

      /* named instance coordinates are stored as design coordinates; */
      /* we have to convert them to normalized coordinates also       */
      if ( FT_NEW_ARRAY( face->blend->normalized_stylecoords,
                         num_axes * num_instances ) )
        goto Exit;

      if ( fvar_head.instanceCount && !face->blend->avar_loaded )
      {
        FT_ULong  offset = FT_STREAM_POS();


        ft_var_load_avar( face );

        if ( FT_STREAM_SEEK( offset ) )
          goto Exit;
      }

      ns  = mmvar->namedstyle;
      nsc = face->blend->normalized_stylecoords;
      for ( i = 0; i < fvar_head.instanceCount; i++, ns++ )
      {
        /* PostScript names add 2 bytes to the instance record size */
        if ( FT_FRAME_ENTER( ( usePsName ? 6L : 4L ) +
                             4L * num_axes ) )
          goto Exit;

        ns->strid       =    FT_GET_USHORT();
        (void) /* flags = */ FT_GET_USHORT();

        c = ns->coords;
        for ( j = 0; j < num_axes; j++, c++ )
          *c = FT_GET_LONG();

        /* valid psid values are 6, [256;32767], and 0xFFFF */
        if ( usePsName )
          ns->psid = FT_GET_USHORT();
        else
          ns->psid = 0xFFFF;

        ft_var_to_normalized( face, num_axes, ns->coords, nsc );
        nsc += num_axes;

        FT_FRAME_EXIT();
      }

      if ( num_instances != fvar_head.instanceCount )
      {
        SFNT_Service  sfnt = (SFNT_Service)face->sfnt;

        FT_Int   found, dummy1, dummy2;
        FT_UInt  strid = ~0U;


        /* the default instance is missing in array the   */
        /* of named instances; try to synthesize an entry */
        found = sfnt->get_name_id( face,
                                   TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY,
                                   &dummy1,
                                   &dummy2 );
        if ( found )
          strid = TT_NAME_ID_TYPOGRAPHIC_SUBFAMILY;
        else
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_FONT_SUBFAMILY,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
            strid = TT_NAME_ID_FONT_SUBFAMILY;
        }

        if ( found )
        {
          found = sfnt->get_name_id( face,
                                     TT_NAME_ID_PS_NAME,
                                     &dummy1,
                                     &dummy2 );
          if ( found )
          {
            FT_TRACE5(( "TT_Get_MM_Var:"
                        " Adding default instance to named instances\n" ));

            ns = &mmvar->namedstyle[fvar_head.instanceCount];

            ns->strid = strid;
            ns->psid  = TT_NAME_ID_PS_NAME;

            a = mmvar->axis;
            c = ns->coords;
            for ( j = 0; j < num_axes; j++, a++, c++ )
              *c = a->def;
          }
        }
      }

      ft_var_load_mvar( face );
    }

    /* fill the output array if requested */

    if ( master )
    {
      FT_UInt  n;


      if ( FT_ALLOC( mmvar, face->blend->mmvar_len ) )
        goto Exit;
      FT_MEM_COPY( mmvar, face->blend->mmvar, face->blend->mmvar_len );

      axis_flags =
        (FT_UShort*)( (char*)mmvar + mmvar_size );
      mmvar->axis =
        (FT_Var_Axis*)( (char*)axis_flags + axis_flags_size );
      mmvar->namedstyle =
        (FT_Var_Named_Style*)( (char*)mmvar->axis+ axis_size );

      next_coords = (FT_Fixed*)( (char*)mmvar->namedstyle +
                                 namedstyle_size );
      for ( n = 0; n < mmvar->num_namedstyles; n++ )
      {
        mmvar->namedstyle[n].coords  = next_coords;
        next_coords                 += num_axes;
      }

      a         = mmvar->axis;
      next_name = (FT_String*)( (char*)mmvar->namedstyle +
                                namedstyle_size + next_coords_size );
      for ( n = 0; n < num_axes; n++ )
      {
        a->name = next_name;

        /* standard PostScript names for some standard apple tags */
        if ( a->tag == TTAG_wght )
          a->name = (char*)"Weight";
        else if ( a->tag == TTAG_wdth )
          a->name = (char*)"Width";
        else if ( a->tag == TTAG_opsz )
          a->name = (char*)"OpticalSize";
        else if ( a->tag == TTAG_slnt )
          a->name = (char*)"Slant";

        next_name += 5;
        a++;
      }

      *master = mmvar;
    }

  Exit:
    return error;
  }